

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

char32_t dpfb::unicode::strToCp(char *str,char **end)

{
  char cVar1;
  bool bVar2;
  char32_t cVar3;
  int iVar4;
  char32_t cVar5;
  uint uVar6;
  byte bVar7;
  char *pcVar8;
  char *pcVar9;
  
  pcVar8 = str + 1;
  do {
    pcVar9 = pcVar8;
    cVar1 = pcVar9[-1];
    iVar4 = isspace((int)cVar1);
    pcVar8 = pcVar9 + 1;
  } while (iVar4 != 0);
  pcVar8 = pcVar9 + -1;
  uVar6 = 10;
  if ((cVar1 == 'U') && (*pcVar9 == '+')) {
    uVar6 = 0x10;
    bVar2 = true;
    pcVar8 = pcVar9 + 1;
  }
  else {
    bVar2 = false;
  }
  cVar3 = L'\0';
  do {
    cVar5 = cVar3;
    pcVar9 = pcVar8 + 1;
    cVar1 = *pcVar8;
    bVar7 = cVar1 - 0x30;
    if (9 < bVar7) {
      if (!bVar2) {
LAB_0011d43d:
        if (end != (char **)0x0) {
          *end = str;
        }
        return cVar5;
      }
      if ((byte)(cVar1 + 0x9fU) < 6) {
        bVar7 = cVar1 + 0xa9;
      }
      else {
        if (5 < (byte)(cVar1 + 0xbfU)) goto LAB_0011d43d;
        bVar7 = cVar1 - 0x37;
      }
    }
    str = pcVar9;
    cVar3 = L'\xffffffff';
    pcVar8 = pcVar9;
    if (((uint)cVar5 <= 0xffffffff / uVar6 && cVar5 != L'\xffffffff') &&
       ((cVar5 != 0xffffffff / uVar6 || ((uint)bVar7 <= 0xffffffffU % uVar6)))) {
      cVar3 = cVar5 * uVar6 + (uint)bVar7;
    }
  } while( true );
}

Assistant:

char32_t strToCp(const char* str, const char** end)
{
    // It's easier to roll our own routine than to use strtol(),
    // because otherwise we need:
    //    1. Ensure there is no leading -.
    //    2. Take into account that strtol() accepts optional "0x"
    //       or "0X" prefixes for base 16, which we should treat
    //       as 0.

    char32_t result = 0;

    const char* strStart = str;

    while (std::isspace(*str))
        ++str;

    int base;
    if (*str == 'U' && str[1] == '+') {
        base = 16;
        str += 2;
    } else
        base = 10;

    const auto max = UINT_LEAST32_MAX;
    const auto cutoff = max / base;
    const auto cutlimit = max % base;

    bool wasDigits = false;
    while (true) {
        unsigned char c = *str;

        if (c >= '0' && c <= '9')
            c -= '0';
        else if (base == 16) {
            if (c >= 'a' && c <= 'f')
                c -= 'a' - 10;
            else if (c >= 'A' && c <= 'F')
                c -= 'A' - 10;
            else
                break;
        } else
            break;

        wasDigits = true;
        ++str;

        if (result == max
                || result > cutoff
                || (result == cutoff && c > cutlimit))
            result = max;
        else {
            result *= base;
            result += c;
        }
    }

    if (end) {
        if (wasDigits)
            *end = str;
        else
            *end = strStart;
    }

    return result;
}